

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall embree::MirrorMaterial::~MirrorMaterial(MirrorMaterial *this)

{
  void *in_RSI;
  
  SceneGraph::Node::~Node((Node *)this);
  SceneGraph::MaterialNode::operator_delete(&this->super_MaterialNode,in_RSI);
  return;
}

Assistant:

struct PREFIX(MirrorMaterial) MATERIAL_BASE_CLASS
  {
#if !defined(ISPC) && !defined(CPPTUTORIAL)
    MirrorMaterial (const Vec3fa& reflectance)
      : base(MATERIAL_MIRROR), reflectance(reflectance) {}
    virtual Material* material() { return &base; }
#endif

    PREFIX(Material) base;
    Vec3fa reflectance;
  }